

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O2

bool __thiscall lambertian::scatter(lambertian *this,ray *r_in,hit_record *rec,scatter_record *srec)

{
  __shared_ptr<cosine_pdf,_(__gnu_cxx::_Lock_policy)2> local_30;
  double local_20;
  
  (*((this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_texture[2])
            (SUB84(rec->u,0),rec->v,&local_30);
  (srec->attenuation).e[2] = local_20;
  (srec->attenuation).e[0] = (double)local_30._M_ptr;
  (srec->attenuation).e[1] = (double)local_30._M_refcount._M_pi;
  std::make_shared<cosine_pdf,vec3_const&>((vec3 *)&local_30);
  std::__shared_ptr<pdf,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<pdf,(__gnu_cxx::_Lock_policy)2> *)&srec->pdf_ptr,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  srec->skip_pdf = false;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, scatter_record& srec) const override {
        srec.attenuation = tex->value(rec.u, rec.v, rec.p);
        srec.pdf_ptr = make_shared<cosine_pdf>(rec.normal);
        srec.skip_pdf = false;
        return true;
    }